

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O3

void __thiscall PP_FDTD_1D::intialState(PP_FDTD_1D *this)

{
  **this->V = 1.0;
  return;
}

Assistant:

void PP_FDTD_1D::intialState(void)
{
    V[0][0] = 1.0;
    /*for(unsigned long k=0 ; k<Nz ; k++)
    {
        //V[0][k] = cos(2*3.14161*4*k/Nz);
        //I[0][k] = cos(2*3.14161*4*k/Nz);
        if((10*k)>(Nz) && (10*k)<(2*Nz))
        {
            V[0][k] = 1.0;
            I[0][k] = 1.0;
        }
        else
        {
            V[0][k] = 0.0;
            I[0][k] = 0.0;
        }
    }*/
    return;
}